

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_graphics.c
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  
  init_demo_menu(menu,0);
  disable_continue_game();
  play_music(6,0);
  return extraout_EAX;
}

Assistant:

static void init(void)
{
   if (!choice_res) {
      int i, n = al_get_num_display_modes(), j = 0;
      choice_res = calloc(n + 1, sizeof *choice_res);
      menu[3].data = (void *)choice_res;
      for (i = 0; i < n; i++) {
         ALLEGRO_DISPLAY_MODE m;
         char str[100];
         al_get_display_mode(i, &m);
         sprintf(str, "%dx%d", m.width, m.height);
         if (!already(str)) {
            if (m.width == screen_width && m.height == screen_height) {
               menu[3].extra = j;
            }
            choice_res[j++] = strdup(str);
         }
      }
   }
   
   init_demo_menu(menu, true);

   menu[1].extra = fullscreen;

   menu[5].extra = use_vsync;
   
   on_fullscreen(menu + 1);
}